

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

bool __thiscall
testing::internal::ExpectationBase::AllPrerequisitesAreSatisfied(ExpectationBase *this)

{
  bool bVar1;
  reference ppEVar2;
  const_iterator __x;
  pointer this_00;
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  *in_RDI;
  ExpectationBase *next;
  const_iterator it;
  ExpectationBase *exp;
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  expectations;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  ExpectationBase *in_stack_ffffffffffffff60;
  allocator_type *in_stack_ffffffffffffff68;
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  *in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  _Self local_60;
  _Self local_58;
  value_type local_50;
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  local_28;
  byte local_1;
  
  MutexBase::AssertHeld((MutexBase *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  std::allocator<const_testing::internal::ExpectationBase_*>::allocator
            ((allocator<const_testing::internal::ExpectationBase_*> *)0x1115ff1);
  std::
  vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
  ::vector(in_RDI,in_stack_ffffffffffffff78,(value_type *)in_stack_ffffffffffffff70,
           in_stack_ffffffffffffff68);
  std::allocator<const_testing::internal::ExpectationBase_*>::~allocator
            ((allocator<const_testing::internal::ExpectationBase_*> *)0x1116019);
  do {
    bVar1 = std::
            vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
            ::empty(in_stack_ffffffffffffff70);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_1 = 1;
LAB_01116170:
      std::
      vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
      ::~vector(in_stack_ffffffffffffff70);
      return (bool)(local_1 & 1);
    }
    in_stack_ffffffffffffff70 = &local_28;
    ppEVar2 = std::
              vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
              ::back((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                      *)in_stack_ffffffffffffff60);
    local_50 = *ppEVar2;
    std::
    vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
    ::pop_back((vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
                *)0x1116055);
    local_58._M_node =
         (_Base_ptr)
         ExpectationSet::begin
                   ((ExpectationSet *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58))
    ;
    while( true ) {
      __x = ExpectationSet::end((ExpectationSet *)
                                CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
      local_60._M_node = __x._M_node;
      bVar1 = std::operator!=(&local_58,&local_60);
      if (!bVar1) break;
      this_00 = std::_Rb_tree_const_iterator<testing::Expectation>::operator->
                          ((_Rb_tree_const_iterator<testing::Expectation> *)0x11160b5);
      in_stack_ffffffffffffff60 = (ExpectationBase *)Expectation::expectation_base(this_00);
      std::__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>::get
                ((__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> *)
                 in_stack_ffffffffffffff60);
      in_stack_ffffffffffffff5f = IsSatisfied(in_stack_ffffffffffffff60);
      if (!(bool)in_stack_ffffffffffffff5f) {
        local_1 = 0;
        goto LAB_01116170;
      }
      std::
      vector<const_testing::internal::ExpectationBase_*,_std::allocator<const_testing::internal::ExpectationBase_*>_>
      ::push_back(in_stack_ffffffffffffff70,(value_type *)__x._M_node);
      std::_Rb_tree_const_iterator<testing::Expectation>::operator++
                ((_Rb_tree_const_iterator<testing::Expectation> *)in_stack_ffffffffffffff60);
    }
  } while( true );
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  g_gmock_mutex.AssertHeld();
  ::std::vector<const ExpectationBase*> expectations(1, this);
  while (!expectations.empty()) {
    const ExpectationBase* exp = expectations.back();
    expectations.pop_back();

    for (ExpectationSet::const_iterator it =
             exp->immediate_prerequisites_.begin();
         it != exp->immediate_prerequisites_.end(); ++it) {
      const ExpectationBase* next = it->expectation_base().get();
      if (!next->IsSatisfied()) return false;
      expectations.push_back(next);
    }
  }
  return true;
}